

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

HighsInt __thiscall presolve::HPresolve::findNonzero(HPresolve *this,HighsInt row,HighsInt col)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  HighsInt y;
  long lVar6;
  int *piVar7;
  int iVar8;
  int *piVar9;
  int *piVar10;
  long lVar11;
  int local_20;
  int local_1c;
  HighsInt Nright;
  HighsInt Nleft;
  
  piVar2 = (this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar8 = piVar2[row];
  if (iVar8 == -1) {
    return -1;
  }
  piVar9 = &local_1c;
  local_1c = -1;
  piVar10 = &local_20;
  local_20 = -1;
  piVar3 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    lVar11 = (long)iVar8;
    if (col < piVar3[lVar11]) {
      iVar1 = piVar4[lVar11];
      lVar6 = (long)iVar1;
      if (lVar6 == -1) goto LAB_00301eef;
      if (col < piVar3[lVar6]) {
        piVar4[lVar11] = piVar5[lVar6];
        piVar5[lVar6] = iVar8;
        lVar11 = lVar6;
        iVar8 = iVar1;
        if (piVar4[lVar6] == -1) goto LAB_00301eef;
      }
      *piVar9 = iVar8;
      piVar7 = piVar4 + lVar11;
      piVar9 = piVar7;
    }
    else {
      if (col <= piVar3[lVar11]) {
LAB_00301eef:
        piVar4 = (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *piVar10 = piVar4[lVar11];
        piVar5 = (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *piVar9 = piVar5[lVar11];
        piVar4[lVar11] = local_20;
        piVar5[lVar11] = local_1c;
        piVar2[row] = iVar8;
        if (piVar3[lVar11] != col) {
          return -1;
        }
        return iVar8;
      }
      iVar1 = piVar5[lVar11];
      lVar6 = (long)iVar1;
      if (lVar6 == -1) goto LAB_00301eef;
      if (piVar3[lVar6] < col) {
        piVar5[lVar11] = piVar4[lVar6];
        piVar4[lVar6] = iVar8;
        lVar11 = lVar6;
        iVar8 = iVar1;
        if (piVar5[lVar6] == -1) goto LAB_00301eef;
      }
      *piVar10 = iVar8;
      piVar7 = piVar5 + lVar11;
      piVar10 = piVar7;
    }
    iVar8 = *piVar7;
  } while( true );
}

Assistant:

HighsInt HPresolve::findNonzero(HighsInt row, HighsInt col) {
  if (rowroot[row] == -1) return -1;

  auto get_row_left = [&](HighsInt pos) -> HighsInt& { return ARleft[pos]; };
  auto get_row_right = [&](HighsInt pos) -> HighsInt& { return ARright[pos]; };
  auto get_row_key = [&](HighsInt pos) { return Acol[pos]; };
  rowroot[row] =
      highs_splay(col, rowroot[row], get_row_left, get_row_right, get_row_key);

  if (Acol[rowroot[row]] == col) return rowroot[row];

  return -1;
}